

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

void resampler_remove_sample(void *_r,int decay)

{
  resampler *r;
  int decay_local;
  void *_r_local;
  
  if (0 < *(int *)((long)_r + 0xc)) {
    if ((*(char *)((long)_r + 0x30) == '\x01') || (*(char *)((long)_r + 0x30) == '\x03')) {
      *(double *)((long)_r + 0x40) =
           (double)*(float *)((long)_r + (long)*(int *)((long)_r + 8) * 4 + 0x248) +
           *(double *)((long)_r + 0x40);
      *(undefined4 *)((long)_r + (long)*(int *)((long)_r + 8) * 4 + 0x248) = 0;
      if ((decay != 0) &&
         (*(double *)((long)_r + 0x40) =
               *(double *)((long)_r + 0x40) - *(double *)((long)_r + 0x40) * 0.0001220703125,
         ABS(*(double *)((long)_r + 0x40)) < 9.999999682655225e-21)) {
        *(undefined8 *)((long)_r + 0x40) = 0;
      }
    }
    *(int *)((long)_r + 0xc) = *(int *)((long)_r + 0xc) + -1;
    *(int *)((long)_r + 8) = (*(int *)((long)_r + 8) + 1) % 0x40;
  }
  return;
}

Assistant:

void resampler_remove_sample(void *_r, int decay)
{
    resampler * r = ( resampler * ) _r;
    if ( r->read_filled > 0 )
    {
        if ( r->quality == RESAMPLER_QUALITY_BLEP || r->quality == RESAMPLER_QUALITY_BLAM )
        {
            r->accumulator += r->buffer_out[ r->read_pos ];
            r->buffer_out[ r->read_pos ] = 0;
            if (decay)
            {
                r->accumulator -= r->accumulator * (1.0f / 8192.0f);
                if (fabs(r->accumulator) < 1e-20f)
                    r->accumulator = 0;
            }
        }
        --r->read_filled;
        r->read_pos = ( r->read_pos + 1 ) % resampler_buffer_size;
    }
}